

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_math.h
# Opt level: O0

uint crnlib::math::bitmask_ofs(uint mask)

{
  undefined4 local_14;
  undefined4 local_10;
  uint ofs;
  uint mask_local;
  
  if (mask == 0) {
    ofs = 0;
  }
  else {
    local_14 = 0;
    for (local_10 = mask; (local_10 & 1) == 0; local_10 = local_10 >> 1) {
      local_14 = local_14 + 1;
    }
    ofs = local_14;
  }
  return ofs;
}

Assistant:

inline uint bitmask_ofs(uint mask)
        {
            if (!mask)
            {
                return 0;
            }
            uint ofs = 0;
            while ((mask & 1U) == 0)
            {
                mask >>= 1U;
                ofs++;
            }
            return ofs;
        }